

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  undefined8 uVar1;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_b8;
  undefined1 local_b0 [56];
  Var local_78;
  
  local_b0._16_8_ = name._M_str;
  local_b0._8_8_ = name._M_len;
  GetLocation(&local_78.loc,this);
  std::make_unique<wabt::ExportModuleField,wabt::Location>((Location *)local_b0);
  uVar1 = local_b0._0_8_;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_b0._0_8_ + 0x40),
             (basic_string_view<char,_std::char_traits<char>_> *)(local_b0 + 8));
  GetLocation((Location *)(local_b0 + 0x18),this);
  Var::Var(&local_78,item_index,(Location *)(local_b0 + 0x18));
  Var::operator=(&((Export *)(uVar1 + 0x40))->var,&local_78);
  Var::~Var(&local_78);
  ((Export *)(uVar1 + 0x40))->kind = kind;
  local_b8._M_head_impl = (ExportModuleField *)local_b0._0_8_;
  local_b0._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                       *)&local_b8);
  if (local_b8._M_head_impl != (ExportModuleField *)0x0) {
    (*((local_b8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_b8._M_head_impl = (ExportModuleField *)0x0;
  if ((long *)local_b0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_b0._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                std::string_view name) {
  auto field = std::make_unique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name;
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}